

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionTime>::reallocate
          (QPodArrayOps<QTzTransitionTime> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QTzTransitionTime>_*,_QTzTransitionTime_*> pVar1;
  
  pVar1 = QTypedArrayData<QTzTransitionTime>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QTzTransitionTime>).d,
                     (this->super_QArrayDataPointer<QTzTransitionTime>).ptr,alloc,option);
  if (pVar1.second != (QTzTransitionTime *)0x0) {
    (this->super_QArrayDataPointer<QTzTransitionTime>).d = pVar1.first;
    (this->super_QArrayDataPointer<QTzTransitionTime>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }